

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O0

void u8_to_u_test(int line,UTF_S8 *str1,UTF_US16 *str2,bool ok)

{
  bool bVar1;
  UTF_RET UVar2;
  int iVar3;
  UTF_C8 *j8;
  size_t j8size;
  char16_t *uj16a;
  size_type sVar4;
  UTF_UC16 local_248 [4];
  UTF_UC16 buf [256];
  UTF_US16 tmp;
  bool ok_local;
  UTF_US16 *str2_local;
  UTF_S8 *str1_local;
  int line_local;
  
  std::__cxx11::u16string::u16string((u16string *)(buf + 0xfc));
  bVar1 = UTF_u8_to_u<(char)63>(str1,(UTF_US16 *)(buf + 0xfc));
  UTF_test(line,bVar1 == ok);
  bVar1 = std::operator==((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                           *)(buf + 0xfc),str2);
  UTF_test(line,bVar1);
  j8 = (UTF_C8 *)std::__cxx11::string::c_str();
  j8size = std::__cxx11::string::size();
  UVar2 = UTF_j8_to_uj16(j8,j8size,local_248,0x100);
  UTF_test(line,UVar2 == UTF_SUCCESS);
  uj16a = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::c_str
                    ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                      *)(buf + 0xfc));
  sVar4 = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                    ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                      *)(buf + 0xfc));
  iVar3 = UTF_uj16_cmpn(uj16a,local_248,sVar4 + 1);
  UTF_test(line,iVar3 == 0);
  std::__cxx11::u16string::~u16string((u16string *)(buf + 0xfc));
  return;
}

Assistant:

void u8_to_u_test(int line, const UTF_S8& str1, const UTF_US16& str2, bool ok)
{
    UTF_US16 tmp;
    UTF_UC16 buf[256];
    UTF_test(line, UTF_u8_to_u<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_j8_to_uj16(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj16_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}